

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElDisc.cpp
# Opt level: O1

void __thiscall
TPZCompElDisc::Shape
          (TPZCompElDisc *this,TPZVec<double> *qsi,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  TPZGeoEl *pTVar1;
  TPZManVector<double,_4> x;
  TPZVec<double> local_70;
  double local_50 [4];
  
  if (this->fUseQsiEta == true) {
    (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x330))
              (this,qsi,phi,dphi);
    return;
  }
  TPZVec<double>::TPZVec(&local_70,0);
  local_70._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018a32e0;
  local_70.fNElements = 3;
  local_70.fNAlloc = 0;
  local_70.fStore = local_50;
  pTVar1 = TPZCompEl::Reference((TPZCompEl *)this);
  (**(code **)(*(long *)pTVar1 + 0x228))(pTVar1,qsi,&local_70);
  (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x330))
            (this,&local_70,phi,dphi);
  if (local_70.fStore == local_50) {
    local_70.fStore = (double *)0x0;
  }
  local_70.fNAlloc = 0;
  local_70._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  if (local_70.fStore != (double *)0x0) {
    operator_delete__(local_70.fStore);
  }
  return;
}

Assistant:

void TPZCompElDisc::Shape(TPZVec<REAL> &qsi,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi){
    if(fUseQsiEta==true){
        this->ShapeX(qsi,phi,dphi);
    }else{

        TPZManVector<REAL,4> x(3);
        this->Reference()->X(qsi,x);
        this->ShapeX(x,phi,dphi);
    }
}